

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O3

void __thiscall Args::Help::process(Help *this,Context *context)

{
  pointer pcVar1;
  HelpPrinterIface *pHVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  long *plVar7;
  HelpHasBeenPrintedException *this_00;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long *plVar9;
  String arg;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  long *plVar6;
  
  pbVar8 = (context->m_it)._M_current;
  if (pbVar8 == (context->m_context).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pHVar2 = (this->m_printer)._M_t.
             super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
             .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
    (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
    goto LAB_0010402c;
  }
  (context->m_it)._M_current = pbVar8 + 1;
  local_70[0] = local_60;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + pbVar8->_M_string_length);
  lVar5 = std::__cxx11::string::find((char *)local_70,0x112366,0);
  if ((lVar5 == 0) ||
     ((lVar5 = std::__cxx11::string::find((char *)local_70,0x112366,0), lVar5 != 0 &&
      (lVar5 = std::__cxx11::string::find((char)local_70,0x2d), lVar5 == 0)))) {
    pHVar2 = (this->m_printer)._M_t.
             super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
             .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
    (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,local_70,g_argsOutStream,0);
  }
  else {
    pHVar2 = (this->m_printer)._M_t.
             super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
             .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
    iVar4 = (*pHVar2->_vptr_HelpPrinterIface[8])(pHVar2,local_70);
    plVar6 = (long *)CONCAT44(extraout_var,iVar4);
    if ((plVar6 == (long *)0x0) || (iVar4 = (**(code **)(*plVar6 + 0x10))(plVar6), iVar4 != 0)) {
      pHVar2 = (this->m_printer)._M_t.
               super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
               .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
      (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
    }
    else {
      pbVar8 = (context->m_it)._M_current;
      plVar9 = plVar6;
      if (pbVar8 != (context->m_context).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        plVar7 = plVar6;
        do {
          plVar9 = plVar7;
          (context->m_it)._M_current = pbVar8 + 1;
          std::__cxx11::string::_M_assign((string *)local_70);
          if (plVar9 == (long *)0x0) goto LAB_00104148;
          iVar4 = (**(code **)(*plVar9 + 0x10))(plVar9);
          if (iVar4 != 0) goto LAB_00104172;
          lVar5 = std::__cxx11::string::find((char *)local_70,0x112366,0);
          if ((lVar5 == 0) ||
             ((lVar5 = std::__cxx11::string::find((char *)local_70,0x112366,0), plVar6 = plVar9,
              lVar5 != 0 &&
              (lVar5 = std::__cxx11::string::find((char)(string *)local_70,0x2d), lVar5 == 0)))) {
            pHVar2 = (this->m_printer)._M_t.
                     super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                     .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
            (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,local_70,g_argsOutStream,plVar9);
            goto LAB_00104015;
          }
          do {
            lVar3 = plVar6[3];
            for (lVar5 = plVar6[2]; lVar5 != lVar3; lVar5 = lVar5 + 0x10) {
              plVar7 = (long *)(**(code **)(**(long **)(lVar5 + 8) + 0x70))
                                         (*(long **)(lVar5 + 8),(string *)local_70);
              if (plVar7 != (long *)0x0) goto LAB_0010412d;
            }
            plVar6 = (long *)plVar6[0x1d];
          } while (plVar6 != (long *)0x0);
          plVar7 = (long *)0x0;
LAB_0010412d:
          pbVar8 = (context->m_it)._M_current;
          plVar6 = plVar9;
        } while (pbVar8 != (context->m_context).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        plVar9 = plVar7;
        if (plVar7 == (long *)0x0) {
LAB_00104148:
          pHVar2 = (this->m_printer)._M_t.
                   super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                   .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
          (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
          goto LAB_00104015;
        }
      }
LAB_00104172:
      pHVar2 = (this->m_printer)._M_t.
               super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
               .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
      (**(code **)(*plVar9 + 0x18))(local_50,plVar9);
      plVar7 = (long *)0x0;
      if (plVar6 != plVar9) {
        plVar7 = plVar6;
      }
      (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,local_50,g_argsOutStream,plVar7);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
LAB_00104015:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
LAB_0010402c:
  (this->super_Arg).m_isDefined = true;
  if (this->m_throwExceptionOnPrint == true) {
    this_00 = (HelpHasBeenPrintedException *)__cxa_allocate_exception(0x30);
    HelpHasBeenPrintedException::HelpHasBeenPrintedException(this_00);
    __cxa_throw(this_00,&HelpHasBeenPrintedException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

inline void
Help::process( Context & context )
{
	if( !context.atEnd() )
	{
		String arg = *context.next();

		// Argument or flag.
		if( details::isArgument( arg ) || details::isFlag( arg ) )
			m_printer->print( arg, g_argsOutStream );
		// Command?
		else
		{
			auto * tmp = m_printer->findArgument( arg );

			// Command.
			if( tmp && tmp->type() == ArgType::Command )
			{
				bool printed = false;

				auto * cmd = static_cast< Command* > ( tmp );

				while( !context.atEnd() )
				{
					arg = *context.next();

					if( tmp && tmp->type() == ArgType::Command )
					{
						cmd = static_cast< Command* > ( tmp );

						// Argument or flag.
						if( details::isArgument( arg ) || details::isFlag( arg ) )
						{
							m_printer->print( arg, g_argsOutStream, cmd );

							printed = true;

							break;
						}
						// Command?
						else
							tmp = cmd->findChild( arg );
					}
					else
						break;
				}

				if( !printed )
				{
					if( tmp )
						m_printer->print( tmp->name(), g_argsOutStream,
							( cmd != tmp ? cmd : nullptr ) );
					else
						m_printer->print( g_argsOutStream );
				}
			}
			else
				m_printer->print( g_argsOutStream );
		}
	}
	else
		m_printer->print( g_argsOutStream );

	setDefined( true );

	if( m_throwExceptionOnPrint )
		throw HelpHasBeenPrintedException();
}